

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderConstExprTests.cpp
# Opt level: O1

void deqp::gls::ShaderConstExpr::addOutputVar(ValueBlock *dst,DataType type,float output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pVVar2;
  uint uVar3;
  vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_> *this;
  Value local_78;
  
  local_78.elements.
  super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.elements.
  super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.name.field_2._8_8_ = 0;
  local_78.elements.
  super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.name._M_string_length = 0;
  local_78.name.field_2._M_allocated_capacity = 0;
  local_78.type.m_data._8_8_ = 0;
  local_78.name._M_dataplus._M_p = (pointer)0x0;
  local_78.type.m_type = TYPE_BASIC;
  local_78.type._4_4_ = 0;
  local_78.type.m_data.array.elementType = (VarType *)0x0;
  glu::VarType::VarType(&local_78.type);
  paVar1 = &local_78.name.field_2;
  local_78.name._M_string_length = 0;
  local_78.name.field_2._M_allocated_capacity =
       local_78.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_78.elements.
  super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.elements.
  super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.elements.
  super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.name._M_dataplus._M_p = (pointer)paVar1;
  std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::emplace_back<glu::sl::Value>
            (&dst->outputs,&local_78);
  if (local_78.elements.
      super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.elements.
                    super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.elements.
                          super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.elements.
                          super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.name._M_dataplus._M_p,local_78.name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_78.type);
  pVVar2 = (dst->outputs).super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_replace
            ((ulong)&pVVar2[-1].name,0,(char *)pVVar2[-1].name._M_string_length,0x1c56982);
  glu::VarType::VarType(&local_78.type,type,PRECISION_LAST);
  glu::VarType::operator=(&pVVar2[-1].type,&local_78.type);
  glu::VarType::~VarType(&local_78.type);
  this = &pVVar2[-1].elements;
  std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::resize(this,1);
  if ((int)type < 0x1f) {
    if (type == TYPE_FLOAT) {
      ((this->super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>)
       ._M_impl.super__Vector_impl_data._M_start)->float32 = output;
      return;
    }
    if (type != TYPE_INT) {
      return;
    }
    uVar3 = (uint)output;
  }
  else {
    if (type == TYPE_UINT) {
      ((this->super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>)
       ._M_impl.super__Vector_impl_data._M_start)->int32 = (deInt32)(long)output;
      return;
    }
    if (type != TYPE_BOOL) {
      return;
    }
    uVar3 = -(uint)(output != 0.0) & 1;
  }
  ((this->super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>).
   _M_impl.super__Vector_impl_data._M_start)->int32 = uVar3;
  return;
}

Assistant:

static void addOutputVar (glu::sl::ValueBlock* dst, glu::DataType type, float output)
{
	dst->outputs.push_back(glu::sl::Value());

	{
		glu::sl::Value&	value	= dst->outputs.back();

		value.name	= "out0";
		value.type	= glu::VarType(type, glu::PRECISION_LAST);
		value.elements.resize(1);

		switch (type)
		{
			case glu::TYPE_INT:
				value.elements[0].int32 = (int)output;
				break;

			case glu::TYPE_UINT:
				value.elements[0].int32 = (unsigned int)output;
				break;

			case glu::TYPE_BOOL:
				value.elements[0].bool32 = output!=0.0f;
				break;

			case glu::TYPE_FLOAT:
				value.elements[0].float32 = output;
				break;

			default:
				DE_ASSERT(false);
		}
	}
}